

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::color_blend_state_is_supported
          (Impl *this,VkPipelineColorBlendStateCreateInfo *info,VkDynamicState *dynamic_states,
          uint32_t num_dynamic_states)

{
  VkBlendOp *pVVar1;
  uint uVar2;
  VkBool32 VVar3;
  VkBlendOp VVar4;
  VkPipelineColorBlendAttachmentState *pVVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  VkBlendOp *pVVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  if ((info->flags < 2) &&
     ((info->flags == 0 ||
      ((this->features).rasterization_order_attachment_access.
       rasterizationOrderColorAttachmentAccess != 0)))) {
    bVar15 = num_dynamic_states != 0;
    bVar12 = bVar15;
    if ((bVar15) && (*dynamic_states != VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT)) {
      uVar6 = 1;
      do {
        uVar11 = uVar6;
        if (num_dynamic_states == uVar11) break;
        uVar6 = uVar11 + 1;
      } while (dynamic_states[uVar11] != VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT);
      bVar12 = uVar11 < num_dynamic_states;
    }
    if (((bVar12) || (info->logicOpEnable == 0)) || ((this->features2).features.logicOp != 0)) {
      bVar12 = bVar15;
      if ((num_dynamic_states != 0) &&
         (*dynamic_states != VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT)) {
        uVar6 = 1;
        do {
          uVar11 = uVar6;
          if (num_dynamic_states == uVar11) break;
          uVar6 = uVar11 + 1;
        } while (dynamic_states[uVar11] != VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT);
        bVar12 = uVar11 < num_dynamic_states;
      }
      if (bVar12) {
        return true;
      }
      if ((num_dynamic_states != 0) &&
         (*dynamic_states != VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT)) {
        uVar6 = 1;
        do {
          uVar11 = uVar6;
          if (num_dynamic_states == uVar11) break;
          uVar6 = uVar11 + 1;
        } while (dynamic_states[uVar11] != VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT);
        bVar15 = uVar11 < num_dynamic_states;
      }
      if (bVar15) {
        return true;
      }
      uVar2 = info->attachmentCount;
      bVar12 = uVar2 != 0;
      if (uVar2 == 0) {
        bVar15 = true;
      }
      else {
        pVVar5 = info->pAttachments;
        VVar3 = (this->props).blend_operation_advanced.advancedBlendAllOperations;
        bVar13 = pVVar5->colorBlendOp + 0xc462f3e0 < 0x2e;
        bVar15 = pVVar5->alphaBlendOp + 0xc462f3e0 < 0x2e;
        if ((!bVar13 && !bVar15) || (pVVar5->alphaBlendOp == pVVar5->colorBlendOp && VVar3 != 0)) {
          pVVar10 = &pVVar5[1].alphaBlendOp;
          uVar7 = 1;
          do {
            uVar9 = uVar7;
            if (uVar2 == uVar9) break;
            pVVar1 = pVVar10 + -3;
            VVar4 = *pVVar10;
            bVar12 = *pVVar1 + 0xc462f3e0 < 0x2e;
            bVar14 = VVar4 + 0xc462f3e0 < 0x2e;
            bVar13 = (bool)(bVar13 | bVar12);
            bVar15 = (bool)(bVar15 | bVar14);
            pVVar10 = pVVar10 + 8;
            uVar7 = uVar9 + 1;
          } while ((!bVar12 && !bVar14) || (VVar4 == *pVVar1 && VVar3 != 0));
          bVar12 = uVar9 < uVar2;
        }
        bVar15 = (bool)((bVar13 | bVar15) ^ 1);
      }
      bVar13 = (bool)(bVar12 ^ 1);
      if ((bVar12 == false) && (!bVar15)) {
        if ((this->props).blend_operation_advanced.advancedBlendMaxColorAttachments < uVar2) {
LAB_00180d4d:
          bVar13 = false;
        }
        else {
          bVar13 = true;
          if (1 < uVar2 && (this->props).blend_operation_advanced.advancedBlendIndependentBlend == 0
             ) {
            pVVar5 = info->pAttachments;
            iVar8 = uVar2 - 1;
            pVVar10 = &pVVar5[1].alphaBlendOp;
            do {
              if ((*pVVar10 != pVVar5->alphaBlendOp) || (pVVar10[-3] != pVVar5->colorBlendOp))
              goto LAB_00180d4d;
              pVVar10 = pVVar10 + 8;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
        }
      }
      return bVar13;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::color_blend_state_is_supported(
		const VkPipelineColorBlendStateCreateInfo *info,
		const VkDynamicState *dynamic_states, uint32_t num_dynamic_states) const
{
	constexpr VkPipelineColorBlendStateCreateFlags supported_flags =
			VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT;

	if (info->flags & ~supported_flags)
		return false;

	if ((info->flags & VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT) != 0 &&
	    features.rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess == VK_FALSE)
		return false;

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT) &&
	    info->logicOpEnable && !features2.features.logicOp)
	{
		return false;
	}

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT) &&
	    !has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT))
	{
		bool has_advanced_color_blend = false;
		bool has_advanced_alpha_blend = false;

		for (uint32_t i = 0; i < info->attachmentCount; i++)
		{
			auto &att = info->pAttachments[i];

			bool advanced_color = blend_op_is_advanced(att.colorBlendOp);
			bool advanced_alpha = blend_op_is_advanced(att.alphaBlendOp);
			has_advanced_color_blend = has_advanced_color_blend || advanced_color;
			has_advanced_alpha_blend = has_advanced_alpha_blend || advanced_alpha;

			if (advanced_color || advanced_alpha)
			{
				if (att.alphaBlendOp != att.colorBlendOp)
					return false;
				if (!props.blend_operation_advanced.advancedBlendAllOperations)
					return false;
			}
		}

		if (has_advanced_color_blend || has_advanced_alpha_blend)
		{
			if (info->attachmentCount > props.blend_operation_advanced.advancedBlendMaxColorAttachments)
				return false;

			if (!props.blend_operation_advanced.advancedBlendIndependentBlend)
			{
				for (uint32_t i = 1; i < info->attachmentCount; i++)
				{
					if (info->pAttachments[i].alphaBlendOp != info->pAttachments[0].alphaBlendOp)
						return false;
					if (info->pAttachments[i].colorBlendOp != info->pAttachments[0].colorBlendOp)
						return false;
				}
			}
		}
	}

	return true;
}